

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall
deqp::gles2::Functional::MatrixCaseUtils::decrement<float,2,2>
          (MatrixCaseUtils *this,Matrix<float,_2,_2> *mat)

{
  long lVar1;
  int c;
  MatrixCaseUtils *pMVar2;
  Matrix<float,_2,_2> *retVal;
  int col;
  long lVar3;
  bool bVar4;
  undefined4 uVar5;
  Matrix<float,_2,_2> MVar6;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = 0;
  pMVar2 = this;
  do {
    lVar3 = 0;
    do {
      uVar5 = 0x3f800000;
      if (lVar1 != lVar3) {
        uVar5 = 0;
      }
      *(undefined4 *)(pMVar2 + lVar3 * 8) = uVar5;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    pMVar2 = pMVar2 + 4;
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  lVar1 = 0;
  do {
    lVar3 = 0;
    do {
      MVar6.m_data.m_data[1].m_data[0] = *(float *)((long)mat + lVar3 * 2 * 4) + -1.0;
      *(float *)(this + lVar3 * 8) = MVar6.m_data.m_data[1].m_data[0];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    mat = (Matrix<float,_2,_2> *)((long)mat + 4);
    this = this + 4;
    bVar4 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar4);
  MVar6.m_data.m_data[0].m_data[0] = -1.0;
  MVar6.m_data.m_data[0].m_data[1] = 0.0;
  MVar6.m_data.m_data[1].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar6.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Rows, Cols> decrement (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) - 1.0f;

	return retVal;
}